

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weak_handle.h
# Opt level: O2

WeakHandle<polyscope::Widget> * __thiscall
polyscope::WeakReferrable::getWeakHandle<polyscope::Widget>
          (WeakHandle<polyscope::Widget> *__return_storage_ptr__,WeakReferrable *this,
          Widget *targetPtr)

{
  uint64_t uVar1;
  __shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  runtime_error *this_00;
  __shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> *this_01;
  __shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  __shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  this_01 = &_Stack_48;
  if (targetPtr == (Widget *)0x0) {
    targetPtr = (Widget *)__dynamic_cast(this,&typeinfo,&Widget::typeinfo,0xffffffffffffffff);
    if (targetPtr == (Widget *)0x0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"[Polyscope] bad getWeakHandle() cast");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    p_Var2 = &_Stack_48;
  }
  else {
    this_01 = &local_38;
    p_Var2 = &local_38;
  }
  std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (this_01,&(this->weakReferrableDummyRef).
                      super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>);
  uVar1 = this->weakReferableUniqueID;
  std::__weak_ptr<int,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<int,void>
            ((__weak_ptr<int,(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__,this_01);
  (__return_storage_ptr__->super_GenericWeakHandle).targetUniqueID = uVar1;
  __return_storage_ptr__->targetPtr = targetPtr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var2->_M_refcount);
  return __return_storage_ptr__;
}

Assistant:

WeakHandle<TargetType> getWeakHandle(TargetType* targetPtr = nullptr) {

    // in the case where we already had a pointer to the target type, just directly generate the wrapper
    if (targetPtr) {
      return WeakHandle<TargetType>(weakReferrableDummyRef, weakReferableUniqueID, targetPtr);
    }

    // otherwise, dynamic_cast to resolve the desired type
    targetPtr = dynamic_cast<TargetType*>(this); // sorry, world
    if (!targetPtr) throw std::runtime_error("[Polyscope] bad getWeakHandle() cast");
    return WeakHandle<TargetType>(weakReferrableDummyRef, weakReferableUniqueID, targetPtr);
  }